

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

int Wlc_BlastGetConst(int *pNum,int nNum)

{
  uint uVar1;
  ulong uVar2;
  
  if (nNum < 1) {
    return 0;
  }
  uVar2 = 0;
  uVar1 = 0;
  do {
    if (pNum[uVar2] != 0) {
      if (pNum[uVar2] != 1) {
        return -1;
      }
      uVar1 = uVar1 | 1 << ((uint)uVar2 & 0x1f);
    }
    uVar2 = uVar2 + 1;
  } while ((uint)nNum != uVar2);
  return uVar1;
}

Assistant:

int Wlc_BlastGetConst( int * pNum, int nNum )
{
    int i, Res = 0;
    for ( i = 0; i < nNum; i++ )
        if ( pNum[i] == 1 )
            Res |= (1 << i);
        else if ( pNum[i] != 0 )
            return -1;
    return Res;
}